

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetFillModeLiteralName(FILL_MODE FillMode)

{
  Char *Message;
  char (*in_R8) [2];
  int local_3c;
  undefined1 local_38 [8];
  string msg;
  char *pcStack_10;
  FILL_MODE FillMode_local;
  
  if (FillMode == FILL_MODE_UNDEFINED) {
    pcStack_10 = "FILL_MODE_UNDEFINED";
  }
  else if (FillMode == FILL_MODE_WIREFRAME) {
    pcStack_10 = "FILL_MODE_WIREFRAME";
  }
  else if (FillMode == FILL_MODE_SOLID) {
    pcStack_10 = "FILL_MODE_SOLID";
  }
  else {
    local_3c = (int)(char)FillMode;
    msg.field_2._M_local_buf[0xf] = FillMode;
    FormatString<char[23],int,char[2]>
              ((string *)local_38,(Diligent *)"Unexpected fill mode (",(char (*) [23])&local_3c,
               (int *)0xcabce5,in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetFillModeLiteralName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x416);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const Char* GetFillModeLiteralName(FILL_MODE FillMode)
{
#define FILL_MODE_TO_STR(Mode) \
    case Mode: return #Mode

    static_assert(FILL_MODE_NUM_MODES == 3, "Please update the switch below to handle the new filter mode");
    switch (FillMode)
    {
        FILL_MODE_TO_STR(FILL_MODE_UNDEFINED);
        FILL_MODE_TO_STR(FILL_MODE_WIREFRAME);
        FILL_MODE_TO_STR(FILL_MODE_SOLID);

        default:
            UNEXPECTED("Unexpected fill mode (", static_cast<int>(FillMode), ")");
            return "UNKNOWN";
    }
#undef FILL_MODE_TO_STR
}